

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O3

Slice __thiscall leveldb::anon_unknown_6::TwoLevelIterator::key(TwoLevelIterator *this)

{
  int iVar1;
  
  iVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar1 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/two_level_iterator.cc"
                  ,0x21,
                  "virtual Slice leveldb::(anonymous namespace)::TwoLevelIterator::key() const");
  }
  if ((this->data_iter_).valid_ != false) {
    return (this->data_iter_).key_;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./table/iterator_wrapper.h"
                ,0x27,"Slice leveldb::IteratorWrapper::key() const");
}

Assistant:

Slice key() const override {
    assert(Valid());
    return data_iter_.key();
  }